

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream * QtPrivate::writeSequentialContainer<QList<QSize>>(QDataStream *s,QList<QSize> *c)

{
  bool bVar1;
  value_type *t;
  QSize *pQVar2;
  long lVar3;
  
  bVar1 = QDataStream::writeQSizeType(s,(c->d).size);
  if (bVar1) {
    pQVar2 = (c->d).ptr;
    for (lVar3 = (c->d).size << 3; lVar3 != 0; lVar3 = lVar3 + -8) {
      ::operator<<(s,pQVar2);
      pQVar2 = pQVar2 + 1;
    }
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}